

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O3

flatcc_builder_vt_ref_t
flatcc_builder_create_vtable
          (flatcc_builder_t *B,flatbuffers_voffset_t *vt,flatbuffers_voffset_t vt_size)

{
  int iVar1;
  int iVar2;
  undefined6 in_register_00000012;
  int iVar3;
  int iVar4;
  flatcc_builder_vt_ref_t fVar5;
  bool bVar6;
  flatcc_iov_state_t iov;
  ulong uVar7;
  flatcc_iovec_t local_a8 [8];
  
  uVar7 = 0;
  bVar6 = (int)CONCAT62(in_register_00000012,vt_size) != 0;
  if (bVar6) {
    uVar7 = (ulong)vt_size;
    local_a8[0].iov_base = vt;
    local_a8[0].iov_len = uVar7;
  }
  iVar4 = (int)uVar7;
  iVar2 = SUB14(bVar6,0);
  if ((B->nest_id == 0) && (B->disable_vt_clustering == 0)) {
    iVar1 = B->emit_end;
    B->emit_end = iVar4 + iVar1;
    iVar2 = (*B->emit)(B->emit_context,local_a8,iVar2,iVar1,uVar7);
    if (iVar2 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                    ,0x2b3,
                    "flatcc_builder_ref_t emit_back(flatcc_builder_t *, flatcc_iov_state_t *)");
    }
    fVar5 = iVar1 + 1;
  }
  else {
    if (uVar7 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                    ,0x295,
                    "flatcc_builder_ref_t emit_front(flatcc_builder_t *, flatcc_iov_state_t *)");
    }
    iVar1 = B->emit_start;
    iVar3 = iVar1 - iVar4;
    iVar2 = (*B->emit)(B->emit_context,local_a8,iVar2,iVar3,uVar7);
    if (iVar2 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                    ,0x299,
                    "flatcc_builder_ref_t emit_front(flatcc_builder_t *, flatcc_iov_state_t *)");
    }
    B->emit_start = iVar3;
    fVar5 = 0;
    if (iVar1 != iVar4) {
      fVar5 = iVar3 + 1;
    }
  }
  return fVar5;
}

Assistant:

flatcc_builder_vt_ref_t flatcc_builder_create_vtable(flatcc_builder_t *B,
        const voffset_t *vt, voffset_t vt_size)
{
    flatcc_builder_vt_ref_t vt_ref;
    iov_state_t iov;
    voffset_t *vt_;
    size_t i;

    /*
     * Only top-level buffer can cluster vtables because only it can
     * extend beyond the end.
     *
     * We write the vtable after the referencing table to maintain
     * the construction invariant that any offset reference has
     * valid emitted data at a higher address, and also that any
     * issued negative emit address represents an offset reference
     * to some flatbuffer object or vector (or possibly a root
     * struct).
     *
     * The vt_ref is stored as the reference + 1 to avoid having 0 as a
     * valid reference (which usually means error). It also idententifies
     * vtable references as the only uneven references, and the only
     * references that can be used multiple times in the same buffer.
     *
     * We do the vtable conversion here so cached vtables can be built
     * hashed and compared more efficiently, and so end users with
     * direct vtable construction don't have to worry about endianness.
     * This also ensures the hash function works the same wrt.
     * collision frequency.
     */

    if (!flatbuffers_is_native_pe()) {
        /* Make space in vtable cache for temporary endian conversion. */
        if (!(vt_ = reserve_buffer(B, flatcc_builder_alloc_vb, B->vb_end, vt_size, 0))) {
            return 0;
        }
        for (i = 0; i < vt_size / sizeof(voffset_t); ++i) {
            write_voffset(&vt_[i], vt[i]);
        }
        vt = vt_;
        /* We don't need to free the reservation since we don't advance any base pointer. */
    }

    init_iov();
    push_iov(vt, vt_size);
    if (is_top_buffer(B) && !B->disable_vt_clustering) {
        /* Note that `emit_back` already returns ref + 1 as we require for vtables. */
        if (0 == (vt_ref = emit_back(B, &iov))) {
            return 0;
        }
    } else {
        if (0 == (vt_ref = emit_front(B, &iov))) {
            return 0;
        }
        /*
         * We don't have a valid 0 ref here, but to be consistent with
         * clustered vtables we offset by one. This cannot be zero
         * either.
         */
        vt_ref += 1;
    }
    return vt_ref;
}